

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextShutdown(ImGuiContext *ctx)

{
  ImGuiStoragePair *pIVar1;
  ImGuiDockNode *node;
  int n;
  ImGuiDockContext *dc;
  ImGuiContext *ctx_local;
  
  for (node._4_4_ = 0; node._4_4_ < (ctx->DockContext).Nodes.Data.Size; node._4_4_ = node._4_4_ + 1)
  {
    pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                       ((ImVector<ImGuiStorage::ImGuiStoragePair> *)&ctx->DockContext,node._4_4_);
    if ((ImGuiDockNode *)(pIVar1->field_1).val_p != (ImGuiDockNode *)0x0) {
      IM_DELETE<ImGuiDockNode>((ImGuiDockNode *)(pIVar1->field_1).val_p);
    }
  }
  return;
}

Assistant:

void ImGui::DockContextShutdown(ImGuiContext* ctx)
{
    ImGuiDockContext* dc  = &ctx->DockContext;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            IM_DELETE(node);
}